

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void aGLInit(void)

{
  undefined8 uVar1;
  int local_c;
  int i;
  
  uVar1 = glGetString(0x1f00);
  aAppDebugPrintf("[agl] GL_VENDOR: %s",uVar1);
  uVar1 = glGetString(0x1f01);
  aAppDebugPrintf("[agl] GL_RENDERER: %s",uVar1);
  uVar1 = glGetString(0x1f02);
  aAppDebugPrintf("[agl] GL_VERSION: %s",uVar1);
  uVar1 = glGetString(0x8b8c);
  aAppDebugPrintf("[agl] GL_SHADING_LANGUAGE_VERSION: %s",uVar1);
  uVar1 = glGetString(0x1f03);
  aAppDebugPrintf("[agl] GL_EXTENSIONS: %s",uVar1);
  a__gl_state.cull_mode = AGLCM_Disable;
  a__gl_state.front_face = AGLFF_CounterClockwise;
  a__gl_state.blend.equation.a = AGLBE_Add;
  a__gl_state.blend.equation.rgb = AGLBE_Add;
  a__gl_state.blend.func.src_a = AGLBF_One;
  a__gl_state.blend.func.src_rgb = AGLBF_One;
  a__gl_state.blend.func.dst_a = AGLBF_Zero;
  a__gl_state.blend.func.dst_rgb = AGLBF_Zero;
  a__gl_state.depth.mode = AGLDM_Disabled;
  a__gl_state.depth.func = AGLDF_Less;
  a__gl_state.attribs_serial = 0;
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    a__gl_state.attribs[local_c].buffer = -1;
    a__gl_state.attribs[local_c].serial = 0;
  }
  return;
}

Assistant:

void aGLInit(void) {
#ifdef ATTO_PLATFORM_WINDOWS
#define ATTO__GET_FUNC(T_, N_) N_ = (T_)a__check_get_proc_address(#N_);
	ATTO__GL_FUNCS_LIST(ATTO__GET_FUNC)
#undef ATTO__GET_FUNC
#endif /* ifdef ATTO_PLATFORM_WINDOWS */

#ifndef ATTO_GL_DONT_PRINT_INFO
	AGL_PRINTFLN("GL_VENDOR: %s", glGetString(GL_VENDOR));
	AGL_PRINTFLN("GL_RENDERER: %s", glGetString(GL_RENDERER));
	AGL_PRINTFLN("GL_VERSION: %s", glGetString(GL_VERSION));
	AGL_PRINTFLN("GL_SHADING_LANGUAGE_VERSION: %s", glGetString(GL_SHADING_LANGUAGE_VERSION));
	AGL_PRINTFLN("GL_EXTENSIONS: %s", glGetString(GL_EXTENSIONS));
#endif

#ifdef ATTO_GL_PRINT_LIMITS
	A__GL_PRINT_LIMIT(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, 1);
	A__GL_PRINT_LIMIT(GL_MAX_CUBE_MAP_TEXTURE_SIZE, 1);
	A__GL_PRINT_LIMIT(GL_MAX_FRAGMENT_UNIFORM_VECTORS, 1);
	A__GL_PRINT_LIMIT(GL_MAX_RENDERBUFFER_SIZE, 1);
	A__GL_PRINT_LIMIT(GL_MAX_TEXTURE_IMAGE_UNITS, 1);
	A__GL_PRINT_LIMIT(GL_MAX_TEXTURE_SIZE, 1);
	A__GL_PRINT_LIMIT(GL_MAX_VARYING_VECTORS, 1);
	A__GL_PRINT_LIMIT(GL_MAX_VERTEX_ATTRIBS, 1);
	A__GL_PRINT_LIMIT(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, 1);
	A__GL_PRINT_LIMIT(GL_MAX_VERTEX_UNIFORM_VECTORS, 1);
	A__GL_PRINT_LIMIT(GL_MAX_VIEWPORT_DIMS, 2);
	A__GL_PRINT_LIMIT(GL_NUM_COMPRESSED_TEXTURE_FORMATS, 1);
	A__GL_PRINT_LIMIT(GL_NUM_SHADER_BINARY_FORMATS, 1);

#ifdef GL_MAX_3D_TEXTURE_SIZE
	A__GL_PRINT_LIMIT(GL_MAX_3D_TEXTURE_SIZE, 1);
#endif
#ifdef GL_MAX_ARRAY_TEXTURE_LAYERS
	A__GL_PRINT_LIMIT(GL_MAX_ARRAY_TEXTURE_LAYERS, 1);
#endif
#ifdef GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS
	A__GL_PRINT_LIMIT(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, 1);
#endif
#ifdef GL_MAX_COLOR_ATTACHMENTS
	A__GL_PRINT_LIMIT(GL_MAX_COLOR_ATTACHMENTS, 1);
#endif
#ifdef GL_MAX_COLOR_TEXTURE_SAMPLES
	A__GL_PRINT_LIMIT(GL_MAX_COLOR_TEXTURE_SAMPLES, 1);
#endif
#ifdef GL_MAX_COMBINED_ATOMIC_COUNTERS
	A__GL_PRINT_LIMIT(GL_MAX_COMBINED_ATOMIC_COUNTERS, 1);
#endif
#ifdef GL_MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS
	A__GL_PRINT_LIMIT(GL_MAX_COMBINED_COMPUTE_UNIFORM_COMPONENTS, 1);
#endif
#ifdef GL_MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS
	A__GL_PRINT_LIMIT(GL_MAX_COMBINED_FRAGMENT_UNIFORM_COMPONENTS, 1);
#endif
#ifdef GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS
	A__GL_PRINT_LIMIT(GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS, 1);
#endif
#ifdef GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS
	A__GL_PRINT_LIMIT(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, 1);
#endif
#ifdef GL_MAX_COMBINED_UNIFORM_BLOCKS
	A__GL_PRINT_LIMIT(GL_MAX_COMBINED_UNIFORM_BLOCKS, 1);
#endif
#ifdef GL_MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS
	A__GL_PRINT_LIMIT(GL_MAX_COMBINED_VERTEX_UNIFORM_COMPONENTS, 1);
#endif
#ifdef GL_MAX_COMPUTE_ATOMIC_COUNTERS
	A__GL_PRINT_LIMIT(GL_MAX_COMPUTE_ATOMIC_COUNTERS, 1);
#endif
#ifdef GL_MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS
	A__GL_PRINT_LIMIT(GL_MAX_COMPUTE_ATOMIC_COUNTER_BUFFERS, 1);
#endif
#ifdef GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS
	A__GL_PRINT_LIMIT(GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS, 1);
#endif
#ifdef GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS
	A__GL_PRINT_LIMIT(GL_MAX_COMPUTE_TEXTURE_IMAGE_UNITS, 1);
#endif
#ifdef GL_MAX_COMPUTE_UNIFORM_BLOCKS
	A__GL_PRINT_LIMIT(GL_MAX_COMPUTE_UNIFORM_BLOCKS, 1);
#endif
#ifdef GL_MAX_COMPUTE_UNIFORM_COMPONENTS
	A__GL_PRINT_LIMIT(GL_MAX_COMPUTE_UNIFORM_COMPONENTS, 1);
#endif
#ifdef GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS
	A__GL_PRINT_LIMIT(GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS, 1);
#endif
#ifdef GL_MAX_CUBE_MAP_TEXTURE_SIZE
	A__GL_PRINT_LIMIT(GL_MAX_CUBE_MAP_TEXTURE_SIZE, 1);
#endif
#ifdef GL_MAX_DRAW_BUFFERS
	A__GL_PRINT_LIMIT(GL_MAX_DRAW_BUFFERS, 1);
#endif
#ifdef GL_MAX_ELEMENT_INDEX
	A__GL_PRINT_LIMIT(GL_MAX_ELEMENT_INDEX, 1);
#endif
#ifdef GL_MAX_ELEMENTS_INDICES
	A__GL_PRINT_LIMIT(GL_MAX_ELEMENTS_INDICES, 1);
#endif
#ifdef GL_MAX_ELEMENTS_VERTICES
	A__GL_PRINT_LIMIT(GL_MAX_ELEMENTS_VERTICES, 1);
#endif
#ifdef GL_MAX_FRAGMENT_ATOMIC_COUNTERS
	A__GL_PRINT_LIMIT(GL_MAX_FRAGMENT_ATOMIC_COUNTERS, 1);
#endif
#ifdef GL_MAX_FRAGMENT_INPUT_COMPONENTS
	A__GL_PRINT_LIMIT(GL_MAX_FRAGMENT_INPUT_COMPONENTS, 1);
#endif
#ifdef GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS
	A__GL_PRINT_LIMIT(GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS, 1);
#endif
#ifdef GL_MAX_FRAGMENT_UNIFORM_BLOCKS
	A__GL_PRINT_LIMIT(GL_MAX_FRAGMENT_UNIFORM_BLOCKS, 1);
#endif
#ifdef GL_MAX_FRAGMENT_UNIFORM_COMPONENTS
	A__GL_PRINT_LIMIT(GL_MAX_FRAGMENT_UNIFORM_COMPONENTS, 1);
#endif
#ifdef GL_MAX_FRAGMENT_UNIFORM_VECTORS
	A__GL_PRINT_LIMIT(GL_MAX_FRAGMENT_UNIFORM_VECTORS, 1);
#endif
#ifdef GL_MAX_FRAMEBUFFER_HEIGHT
	A__GL_PRINT_LIMIT(GL_MAX_FRAMEBUFFER_HEIGHT, 1);
#endif
#ifdef GL_MAX_FRAMEBUFFER_SAMPLES
	A__GL_PRINT_LIMIT(GL_MAX_FRAMEBUFFER_SAMPLES, 1);
#endif
#ifdef GL_MAX_FRAMEBUFFER_WIDTH
	A__GL_PRINT_LIMIT(GL_MAX_FRAMEBUFFER_WIDTH, 1);
#endif
#ifdef GL_MAX_INTEGER_SAMPLES
	A__GL_PRINT_LIMIT(GL_MAX_INTEGER_SAMPLES, 1);
#endif
#ifdef GL_MAX_PROGRAM_TEXEL_OFFSET
	A__GL_PRINT_LIMIT(GL_MAX_PROGRAM_TEXEL_OFFSET, 1);
#endif
#ifdef GL_MAX_RENDERBUFFER_SIZE
	A__GL_PRINT_LIMIT(GL_MAX_RENDERBUFFER_SIZE, 1);
#endif
#ifdef GL_MAX_SAMPLE_MASK_WORDS
	A__GL_PRINT_LIMIT(GL_MAX_SAMPLE_MASK_WORDS, 1);
#endif
#ifdef GL_MAX_SAMPLES
	A__GL_PRINT_LIMIT(GL_MAX_SAMPLES, 1);
#endif
#ifdef GL_MAX_SERVER_WAIT_TIMEOUT
	A__GL_PRINT_LIMIT(GL_MAX_SERVER_WAIT_TIMEOUT, 1);
#endif
#ifdef GL_MAX_SHADER_STORAGE_BLOCK_SIZE
	A__GL_PRINT_LIMIT(GL_MAX_SHADER_STORAGE_BLOCK_SIZE, 1);
#endif
#ifdef GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS
	A__GL_PRINT_LIMIT(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, 1);
#endif
#ifdef GL_MAX_TEXTURE_IMAGE_UNITS
	A__GL_PRINT_LIMIT(GL_MAX_TEXTURE_IMAGE_UNITS, 1);
#endif
#ifdef GL_MAX_TEXTURE_LOD_BIAS
	A__GL_PRINT_LIMIT(GL_MAX_TEXTURE_LOD_BIAS, 1);
#endif
#ifdef GL_MAX_TEXTURE_SIZE
	A__GL_PRINT_LIMIT(GL_MAX_TEXTURE_SIZE, 1);
#endif
#ifdef GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS
	A__GL_PRINT_LIMIT(GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS, 1);
#endif
#ifdef GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS
	A__GL_PRINT_LIMIT(GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS, 1);
#endif
#ifdef GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS
	A__GL_PRINT_LIMIT(GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS, 1);
#endif
#ifdef GL_MAX_UNIFORM_BLOCK_SIZE
	A__GL_PRINT_LIMIT(GL_MAX_UNIFORM_BLOCK_SIZE, 1);
#endif
#ifdef GL_MAX_UNIFORM_BUFFER_BINDINGS
	A__GL_PRINT_LIMIT(GL_MAX_UNIFORM_BUFFER_BINDINGS, 1);
#endif
#ifdef GL_MAX_UNIFORM_LOCATIONS
	A__GL_PRINT_LIMIT(GL_MAX_UNIFORM_LOCATIONS, 1);
#endif
#ifdef GL_MAX_VARYING_COMPONENTS
	A__GL_PRINT_LIMIT(GL_MAX_VARYING_COMPONENTS, 1);
#endif
#ifdef GL_MAX_VARYING_VECTORS
	A__GL_PRINT_LIMIT(GL_MAX_VARYING_VECTORS, 1);
#endif
#ifdef GL_MAX_VERTEX_ATOMIC_COUNTERS
	A__GL_PRINT_LIMIT(GL_MAX_VERTEX_ATOMIC_COUNTERS, 1);
#endif
#ifdef GL_MAX_VERTEX_ATTRIB_BINDINGS
	A__GL_PRINT_LIMIT(GL_MAX_VERTEX_ATTRIB_BINDINGS, 1);
#endif
#ifdef GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET
	A__GL_PRINT_LIMIT(GL_MAX_VERTEX_ATTRIB_RELATIVE_OFFSET, 1);
#endif
#ifdef GL_MAX_VERTEX_ATTRIBS
	A__GL_PRINT_LIMIT(GL_MAX_VERTEX_ATTRIBS, 1);
#endif
#ifdef GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS
	A__GL_PRINT_LIMIT(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, 1);
#endif
#ifdef GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS
	A__GL_PRINT_LIMIT(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, 1);
#endif
#ifdef GL_MAX_VERTEX_OUTPUT_COMPONENTS
	A__GL_PRINT_LIMIT(GL_MAX_VERTEX_OUTPUT_COMPONENTS, 1);
#endif
#ifdef GL_MAX_VERTEX_UNIFORM_BLOCKS
	A__GL_PRINT_LIMIT(GL_MAX_VERTEX_UNIFORM_BLOCKS, 1);
#endif
#ifdef GL_MAX_VERTEX_UNIFORM_COMPONENTS
	A__GL_PRINT_LIMIT(GL_MAX_VERTEX_UNIFORM_COMPONENTS, 1);
#endif
#ifdef GL_MAX_VERTEX_UNIFORM_VECTORS
	A__GL_PRINT_LIMIT(GL_MAX_VERTEX_UNIFORM_VECTORS, 1);
#endif

// INDEXED
//GL_MAX_COMPUTE_WORK_GROUP_COUNT
//GL_MAX_COMPUTE_WORK_GROUP_SIZE

	glGetError();
#endif

	/* default initial GL state */
	a__gl_state.cull_mode = AGLCM_Disable;
	a__gl_state.front_face = AGLFF_CounterClockwise;
	a__gl_state.blend.equation.rgb = a__gl_state.blend.equation.a = AGLBE_Add;
	a__gl_state.blend.func.src_rgb = a__gl_state.blend.func.src_a = AGLBF_One;
	a__gl_state.blend.func.dst_rgb = a__gl_state.blend.func.dst_a = AGLBF_Zero;
	a__gl_state.depth.mode = AGLDM_Disabled;
	a__gl_state.depth.func = AGLDF_Less;

	a__gl_state.attribs_serial = 0;
	for (int i = 0; i < ATTO_GL_MAX_ATTRIBS; ++i) {
		a__gl_state.attribs[i].buffer = -1;
		a__gl_state.attribs[i].serial = 0;
	}
}